

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O3

void Ssc_GiaClassesCheckPairs(Gia_Man_t *p,Vec_Int_t *vDisPairs)

{
  int iVar1;
  long lVar2;
  
  iVar1 = vDisPairs->nSize;
  if (1 < iVar1) {
    lVar2 = 1;
    do {
      if (vDisPairs->pArray[lVar2 + -1] == ((uint)p->pReprs[vDisPairs->pArray[lVar2]] & 0xfffffff))
      {
        printf("Pair (%d, %d) are still equivalent.\n");
        iVar1 = vDisPairs->nSize;
      }
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < iVar1);
  }
  return;
}

Assistant:

void Ssc_GiaClassesCheckPairs( Gia_Man_t * p, Vec_Int_t * vDisPairs )
{
    int i, iRepr, iObj, Result = 1;
    Vec_IntForEachEntryDouble( vDisPairs, iRepr, iObj, i )
        if ( iRepr == Gia_ObjRepr(p, iObj) )
            printf( "Pair (%d, %d) are still equivalent.\n", iRepr, iObj ), Result = 0;
//    if ( Result )
//        printf( "Classes are refined correctly.\n" );
}